

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

void vkt::ubo::anon_unknown_0::generateDeclaration
               (ostringstream *src,int blockNdx,UniformBlock *block,UniformLayout *layout,
               bool shuffleUniformMembers)

{
  Uniform **ppUVar1;
  deUint32 flagsMask;
  LayoutFlagsFmt LVar2;
  Uniform *name_00;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  string *psVar8;
  __normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
  it;
  LayoutFlagsFmt LVar9;
  Traverser<const_vkt::ubo::Uniform> uniforms;
  ostringstream name;
  deUint32 dStack_1c4;
  long local_1c0;
  string local_50;
  
  poVar4 = std::operator<<((ostream *)src,"layout(set = 0, binding = ");
  std::ostream::operator<<(poVar4,blockNdx);
  if ((block->m_flags & 0x1f8) != 0) {
    poVar4 = std::operator<<((ostream *)src,", ");
    dStack_1c4 = 0;
    _name = block->m_flags & 0x1f8;
    operator<<(poVar4,(LayoutFlagsFmt *)&name);
  }
  std::operator<<((ostream *)src,") ");
  poVar4 = std::operator<<((ostream *)src,"uniform ");
  std::operator<<(poVar4,(string *)block);
  std::operator<<((ostream *)src,"\n{\n");
  LVar9 = (LayoutFlagsFmt)
          (block->m_uniforms).
          super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl.
          super__Vector_impl_data._M_start;
  LVar2 = (LayoutFlagsFmt)
          (block->m_uniforms).
          super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl.
          super__Vector_impl_data._M_finish;
  uniforms.m_elements.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniforms.m_next._M_current = (Uniform **)0x0;
  uniforms.m_elements.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uniforms.m_elements.
  super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; LVar9 != LVar2; LVar9 = (LayoutFlagsFmt)((long)LVar9 + 0x40)) {
    _name = LVar9;
    std::vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>>::
    emplace_back<vkt::ubo::Uniform_const*>
              ((vector<vkt::ubo::Uniform_const*,std::allocator<vkt::ubo::Uniform_const*>> *)
               &uniforms,(Uniform **)&name);
  }
  if (shuffleUniformMembers) {
    std::vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>::vector
              ((vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_> *)
               &name,&uniforms.m_elements);
    uVar7 = (ulong)(local_1c0 - (long)_name) >> 3;
    if (uniforms.m_elements.
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        uniforms.m_elements.
        super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uniforms.m_elements.
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           uniforms.m_elements.
           super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    iVar5 = -1;
    while (uVar6 = (uint)uVar7, uVar6 != 0) {
      iVar5 = iVar5 + uVar6;
      std::vector<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>::push_back
                (&uniforms.m_elements,(value_type *)((long)iVar5 * 8 + (long)_name));
      uVar3 = ~uVar6;
      if (0 < (int)uVar6) {
        uVar3 = 1 - uVar6;
      }
      uVar7 = (ulong)uVar3;
    }
    std::_Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>::
    ~_Vector_base((_Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                   *)&name);
  }
  uniforms.m_next._M_current =
       uniforms.m_elements.
       super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
LAB_00667490:
  if (uniforms.m_next._M_current !=
      uniforms.m_elements.
      super__Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppUVar1 = uniforms.m_next._M_current + 1;
    name_00 = *uniforms.m_next._M_current;
    uniforms.m_next._M_current = ppUVar1;
    if (name_00 != (Uniform *)0x0) {
      _name = 1;
      operator<<((ostream *)src,(Indent *)&name);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      if ((block->m_instanceName)._M_string_length != 0) {
        poVar4 = std::operator<<((ostream *)&name,(string *)block);
        std::operator<<(poVar4,".");
      }
      std::operator<<((ostream *)&name,(string *)name_00);
      psVar8 = (string *)&name_00->m_type;
LAB_00667513:
      iVar5 = *(int *)&psVar8->field_0x0;
      if (iVar5 == 1) {
        std::operator<<((ostream *)&name,"[0]");
        psVar8 = *(string **)(psVar8 + 8);
        iVar5 = *(int *)&psVar8->field_0x0;
      }
      else if (iVar5 == 0) goto LAB_0066755c;
      if (iVar5 == 2) {
        psVar8 = *(string **)(*(long *)(psVar8 + 8) + 0x20);
        poVar4 = std::operator<<((ostream *)&name,".");
        std::operator<<(poVar4,psVar8);
        psVar8 = psVar8 + 0x20;
      }
      goto LAB_00667513;
    }
  }
  std::operator<<((ostream *)src,"}");
  if ((block->m_instanceName)._M_string_length != 0) {
    poVar4 = std::operator<<((ostream *)src," ");
    std::operator<<(poVar4,(string *)&block->m_instanceName);
    if (0 < block->m_arraySize) {
      poVar4 = std::operator<<((ostream *)src,"[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,block->m_arraySize);
      std::operator<<(poVar4,"]");
    }
  }
  std::operator<<((ostream *)src,";\n");
  std::_Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>::
  ~_Vector_base((_Vector_base<const_vkt::ubo::Uniform_*,_std::allocator<const_vkt::ubo::Uniform_*>_>
                 *)&uniforms);
  return;
LAB_0066755c:
  std::__cxx11::stringbuf::str();
  iVar5 = UniformLayout::getUniformLayoutIndex(layout,blockNdx,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  flagsMask = (layout->uniforms).
              super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar5].offset;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  uVar6 = name_00->m_flags;
  if ((uVar6 & 0x1f8) != 0) {
    poVar4 = std::operator<<((ostream *)src,"layout(");
    dStack_1c4 = 0;
    _name = name_00->m_flags & 0x1f8;
    operator<<(poVar4,(LayoutFlagsFmt *)&name);
    std::operator<<(poVar4,") ");
    uVar6 = name_00->m_flags;
  }
  generateDeclaration(src,&name_00->m_type,&name_00->m_name,uVar6 & 0x1800,0xffffffff,flagsMask,
                      (deUint32)src);
  goto LAB_00667490;
}

Assistant:

void generateDeclaration (std::ostringstream& src, int blockNdx, const UniformBlock& block, const UniformLayout& layout, bool shuffleUniformMembers)
{
	src << "layout(set = 0, binding = " << blockNdx;
	if ((block.getFlags() & LAYOUT_MASK) != 0)
		src << ", " << LayoutFlagsFmt(block.getFlags() & LAYOUT_MASK);
	src << ") ";

	src << "uniform " << block.getBlockName();
	src << "\n{\n";

	Traverser<const Uniform> uniforms(block.begin(), block.end(), shuffleUniformMembers);

	while (const Uniform* pUniform = uniforms.next())
	{
		src << Indent(1);
		generateDeclaration(src, *pUniform, 1 /* indent level */, getBlockMemberOffset(blockNdx, block, *pUniform, layout));
	}

	src << "}";

	if (block.hasInstanceName())
	{
		src << " " << block.getInstanceName();
		if (block.isArray())
			src << "[" << block.getArraySize() << "]";
	}
	else
		DE_ASSERT(!block.isArray());

	src << ";\n";
}